

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctest.c
# Opt level: O1

wchar_t wchar_ptr_Compare(wchar_t *left,wchar_t *right)

{
  wchar_t wVar1;
  
  wVar1 = L'\x01';
  if (left == (wchar_t *)0x0) {
    wVar1 = (uint)(left == (wchar_t *)0x0 && right == (wchar_t *)0x0) + L'\xffffffff';
  }
  if (left == (wchar_t *)0x0 || right == (wchar_t *)0x0) {
    return wVar1;
  }
  wVar1 = wcscmp(left,right);
  return wVar1;
}

Assistant:

int wchar_ptr_Compare(const wchar_t* left, const wchar_t* right)
{
    if ((left == NULL) &&
        (right == NULL))
    {
        return 0;
    }
    else if (left == NULL)
    {
        return -1;
    }
    else if (right == NULL)
    {
        return 1;
    }
    else
    {
        return wcscmp(left, right);
    }
}